

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_duplex.cpp
# Opt level: O1

void device_collection_changed_callback(cubeb *context,void *user)

{
  bool bVar1;
  stringstream *this;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertHelper local_40;
  AssertionResult gtest_ar_;
  char *local_28 [2];
  
  fwrite("collection changed callback\n",0x1c,1,_stderr);
  gtest_ar_.success_ = false;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  this = (stringstream *)operator_new(0x188);
  std::__cxx11::stringstream::stringstream(this);
  *(undefined8 *)(this + *(long *)(*(long *)(this + 0x10) + -0x18) + 0x18) = 0x11;
  local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(this + 0x10),
             "Error: device collection changed callback called when opening a stream",0x46);
  testing::internal::GetBoolAssertionFailureMessage
            ((internal *)local_28,&gtest_ar_,"false","false","true");
  testing::internal::AssertHelper::AssertHelper
            (&local_40,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_duplex.cpp"
             ,0x88,local_28[0]);
  testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
  testing::internal::AssertHelper::~AssertHelper(&local_40);
  if (local_28[0] != (char *)0x0) {
    operator_delete__(local_28[0]);
  }
  if (local_48.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_48.ptr_ + 8))();
    }
    local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  return;
}

Assistant:

void device_collection_changed_callback(cubeb * context, void * user)
{
  fprintf(stderr, "collection changed callback\n");
  ASSERT_TRUE(false) << "Error: device collection changed callback"
                        " called when opening a stream";
}